

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall wabt::SharedValidator::OnRethrow(SharedValidator *this,Location *loc,Var *depth)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = CheckInstr(this,(Opcode)0x9,loc);
  if (depth->type_ == Index) {
    RVar2 = TypeChecker::OnRethrow(&this->typechecker_,(depth->field_2).index_);
    RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnRethrow(const Location& loc, Var depth) {
  Result result = CheckInstr(Opcode::Rethrow, loc);
  result |= typechecker_.OnRethrow(depth.index());
  return result;
}